

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_db_status(sqlite3 *db,int op,int *pCurrent,int *pHighwater,int resetFlag)

{
  int iVar1;
  int iVar2;
  sqlite3_uint64 sVar3;
  Pager *pPager_00;
  bool local_9d;
  Pager *pPager_1;
  int local_80;
  int nRet;
  int i_2;
  int nByte_2;
  Vdbe *pVdbe;
  HashElem *p_1;
  Schema *pSchema;
  int local_58;
  int nByte_1;
  int i_1;
  int nByte;
  Pager *pPager;
  Btree *pBt;
  int i;
  int totalUsed;
  LookasideSlot *p;
  int rc;
  int resetFlag_local;
  int *pHighwater_local;
  int *pCurrent_local;
  sqlite3 *psStack_10;
  int op_local;
  sqlite3 *db_local;
  
  p._0_4_ = 0;
  p._4_4_ = resetFlag;
  _rc = (u32 *)pHighwater;
  pHighwater_local = pCurrent;
  pCurrent_local._4_4_ = op;
  psStack_10 = db;
  sqlite3_mutex_enter(db->mutex);
  switch(pCurrent_local._4_4_) {
  case 0:
    iVar1 = sqlite3LookasideUsed(psStack_10,(int *)_rc);
    *pHighwater_local = iVar1;
    if ((p._4_4_ != 0) && (_i = (psStack_10->lookaside).pFree, _i != (LookasideSlot *)0x0)) {
      for (; _i->pNext != (LookasideSlot *)0x0; _i = _i->pNext) {
      }
      _i->pNext = (psStack_10->lookaside).pInit;
      (psStack_10->lookaside).pInit = (psStack_10->lookaside).pFree;
      (psStack_10->lookaside).pFree = (LookasideSlot *)0x0;
    }
    break;
  case 1:
  case 0xb:
    pBt._4_4_ = 0;
    sqlite3BtreeEnterAll(psStack_10);
    for (pBt._0_4_ = 0; (int)pBt < psStack_10->nDb; pBt._0_4_ = (int)pBt + 1) {
      pPager = (Pager *)psStack_10->aDb[(int)pBt].pBt;
      if (pPager != (Pager *)0x0) {
        _i_1 = sqlite3BtreePager((Btree *)pPager);
        iVar1 = sqlite3PagerMemUsed(_i_1);
        nByte_1 = iVar1;
        if (pCurrent_local._4_4_ == 0xb) {
          iVar2 = sqlite3BtreeConnectionCount((Btree *)pPager);
          nByte_1 = iVar1 / iVar2;
        }
        pBt._4_4_ = nByte_1 + pBt._4_4_;
      }
    }
    sqlite3BtreeLeaveAll(psStack_10);
    *pHighwater_local = pBt._4_4_;
    *_rc = 0;
    break;
  case 2:
    pSchema._4_4_ = 0;
    sqlite3BtreeEnterAll(psStack_10);
    psStack_10->pnBytesFreed = (int *)((long)&pSchema + 4);
    for (local_58 = 0; local_58 < psStack_10->nDb; local_58 = local_58 + 1) {
      p_1 = (HashElem *)psStack_10->aDb[local_58].pSchema;
      if ((Schema *)p_1 != (Schema *)0x0) {
        iVar1 = (*sqlite3Config.m.xRoundup)(0x20);
        pSchema._4_4_ =
             iVar1 * (*(int *)((long)&p_1->prev + 4) + *(int *)((long)&p_1[1].pKey + 4) +
                      *(int *)((long)&p_1[1].next + 4) + *(int *)((long)&p_1[2].data + 4)) +
             pSchema._4_4_;
        sVar3 = sqlite3_msize(p_1->pKey);
        pSchema._4_4_ = pSchema._4_4_ + (int)sVar3;
        sVar3 = sqlite3_msize(p_1[2].prev);
        pSchema._4_4_ = pSchema._4_4_ + (int)sVar3;
        sVar3 = sqlite3_msize(p_1[1].data);
        pSchema._4_4_ = pSchema._4_4_ + (int)sVar3;
        sVar3 = sqlite3_msize(p_1[3].next);
        pSchema._4_4_ = pSchema._4_4_ + (int)sVar3;
        for (pVdbe = (Vdbe *)p_1[2].next; pVdbe != (Vdbe *)0x0; pVdbe = (Vdbe *)pVdbe->db) {
          sqlite3DeleteTrigger(psStack_10,(Trigger *)pVdbe->pNext);
        }
        for (pVdbe = (Vdbe *)p_1->data; pVdbe != (Vdbe *)0x0; pVdbe = (Vdbe *)pVdbe->db) {
          sqlite3DeleteTable(psStack_10,(Table *)pVdbe->pNext);
        }
      }
    }
    psStack_10->pnBytesFreed = (int *)0x0;
    sqlite3BtreeLeaveAll(psStack_10);
    *_rc = 0;
    *pHighwater_local = pSchema._4_4_;
    break;
  case 3:
    nRet = 0;
    psStack_10->pnBytesFreed = &nRet;
    for (_i_2 = psStack_10->pVdbe; _i_2 != (Vdbe *)0x0; _i_2 = _i_2->pNext) {
      sqlite3VdbeClearObject(psStack_10,_i_2);
      sqlite3DbFree(psStack_10,_i_2);
    }
    psStack_10->pnBytesFreed = (int *)0x0;
    *_rc = 0;
    *pHighwater_local = nRet;
    break;
  case 4:
  case 5:
  case 6:
    *pHighwater_local = 0;
    *_rc = (psStack_10->lookaside).anStat[pCurrent_local._4_4_ + -4];
    if (p._4_4_ != 0) {
      (psStack_10->lookaside).anStat[pCurrent_local._4_4_ + -4] = 0;
    }
    break;
  case 10:
    *_rc = 0;
    local_9d = true;
    if (psStack_10->nDeferredImmCons < 1) {
      local_9d = 0 < psStack_10->nDeferredCons;
    }
    *pHighwater_local = (uint)local_9d;
    break;
  case 0xc:
    pCurrent_local._4_4_ = 10;
  case 7:
  case 8:
  case 9:
    pPager_1._4_4_ = 0;
    for (local_80 = 0; local_80 < psStack_10->nDb; local_80 = local_80 + 1) {
      if (psStack_10->aDb[local_80].pBt != (Btree *)0x0) {
        pPager_00 = sqlite3BtreePager(psStack_10->aDb[local_80].pBt);
        sqlite3PagerCacheStat(pPager_00,pCurrent_local._4_4_,p._4_4_,(int *)((long)&pPager_1 + 4));
      }
    }
    *_rc = 0;
    *pHighwater_local = pPager_1._4_4_;
    break;
  default:
    p._0_4_ = 1;
  }
  sqlite3_mutex_leave(psStack_10->mutex);
  return (int)p;
}

Assistant:

SQLITE_API int sqlite3_db_status(
  sqlite3 *db,          /* The database connection whose status is desired */
  int op,               /* Status verb */
  int *pCurrent,        /* Write current value here */
  int *pHighwater,      /* Write high-water mark here */
  int resetFlag         /* Reset high-water mark if true */
){
  int rc = SQLITE_OK;   /* Return code */
#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) || pCurrent==0|| pHighwater==0 ){
    return SQLITE_MISUSE_BKPT;
  }
#endif
  sqlite3_mutex_enter(db->mutex);
  switch( op ){
    case SQLITE_DBSTATUS_LOOKASIDE_USED: {
      *pCurrent = sqlite3LookasideUsed(db, pHighwater);
      if( resetFlag ){
        LookasideSlot *p = db->lookaside.pFree;
        if( p ){
          while( p->pNext ) p = p->pNext;
          p->pNext = db->lookaside.pInit;
          db->lookaside.pInit = db->lookaside.pFree;
          db->lookaside.pFree = 0;
        }
      }
      break;
    }

    case SQLITE_DBSTATUS_LOOKASIDE_HIT:
    case SQLITE_DBSTATUS_LOOKASIDE_MISS_SIZE:
    case SQLITE_DBSTATUS_LOOKASIDE_MISS_FULL: {
      testcase( op==SQLITE_DBSTATUS_LOOKASIDE_HIT );
      testcase( op==SQLITE_DBSTATUS_LOOKASIDE_MISS_SIZE );
      testcase( op==SQLITE_DBSTATUS_LOOKASIDE_MISS_FULL );
      assert( (op-SQLITE_DBSTATUS_LOOKASIDE_HIT)>=0 );
      assert( (op-SQLITE_DBSTATUS_LOOKASIDE_HIT)<3 );
      *pCurrent = 0;
      *pHighwater = db->lookaside.anStat[op - SQLITE_DBSTATUS_LOOKASIDE_HIT];
      if( resetFlag ){
        db->lookaside.anStat[op - SQLITE_DBSTATUS_LOOKASIDE_HIT] = 0;
      }
      break;
    }

    /* 
    ** Return an approximation for the amount of memory currently used
    ** by all pagers associated with the given database connection.  The
    ** highwater mark is meaningless and is returned as zero.
    */
    case SQLITE_DBSTATUS_CACHE_USED_SHARED:
    case SQLITE_DBSTATUS_CACHE_USED: {
      int totalUsed = 0;
      int i;
      sqlite3BtreeEnterAll(db);
      for(i=0; i<db->nDb; i++){
        Btree *pBt = db->aDb[i].pBt;
        if( pBt ){
          Pager *pPager = sqlite3BtreePager(pBt);
          int nByte = sqlite3PagerMemUsed(pPager);
          if( op==SQLITE_DBSTATUS_CACHE_USED_SHARED ){
            nByte = nByte / sqlite3BtreeConnectionCount(pBt);
          }
          totalUsed += nByte;
        }
      }
      sqlite3BtreeLeaveAll(db);
      *pCurrent = totalUsed;
      *pHighwater = 0;
      break;
    }

    /*
    ** *pCurrent gets an accurate estimate of the amount of memory used
    ** to store the schema for all databases (main, temp, and any ATTACHed
    ** databases.  *pHighwater is set to zero.
    */
    case SQLITE_DBSTATUS_SCHEMA_USED: {
      int i;                      /* Used to iterate through schemas */
      int nByte = 0;              /* Used to accumulate return value */

      sqlite3BtreeEnterAll(db);
      db->pnBytesFreed = &nByte;
      for(i=0; i<db->nDb; i++){
        Schema *pSchema = db->aDb[i].pSchema;
        if( ALWAYS(pSchema!=0) ){
          HashElem *p;

          nByte += sqlite3GlobalConfig.m.xRoundup(sizeof(HashElem)) * (
              pSchema->tblHash.count 
            + pSchema->trigHash.count
            + pSchema->idxHash.count
            + pSchema->fkeyHash.count
          );
          nByte += sqlite3_msize(pSchema->tblHash.ht);
          nByte += sqlite3_msize(pSchema->trigHash.ht);
          nByte += sqlite3_msize(pSchema->idxHash.ht);
          nByte += sqlite3_msize(pSchema->fkeyHash.ht);

          for(p=sqliteHashFirst(&pSchema->trigHash); p; p=sqliteHashNext(p)){
            sqlite3DeleteTrigger(db, (Trigger*)sqliteHashData(p));
          }
          for(p=sqliteHashFirst(&pSchema->tblHash); p; p=sqliteHashNext(p)){
            sqlite3DeleteTable(db, (Table *)sqliteHashData(p));
          }
        }
      }
      db->pnBytesFreed = 0;
      sqlite3BtreeLeaveAll(db);

      *pHighwater = 0;
      *pCurrent = nByte;
      break;
    }

    /*
    ** *pCurrent gets an accurate estimate of the amount of memory used
    ** to store all prepared statements.
    ** *pHighwater is set to zero.
    */
    case SQLITE_DBSTATUS_STMT_USED: {
      struct Vdbe *pVdbe;         /* Used to iterate through VMs */
      int nByte = 0;              /* Used to accumulate return value */

      db->pnBytesFreed = &nByte;
      for(pVdbe=db->pVdbe; pVdbe; pVdbe=pVdbe->pNext){
        sqlite3VdbeClearObject(db, pVdbe);
        sqlite3DbFree(db, pVdbe);
      }
      db->pnBytesFreed = 0;

      *pHighwater = 0;  /* IMP: R-64479-57858 */
      *pCurrent = nByte;

      break;
    }

    /*
    ** Set *pCurrent to the total cache hits or misses encountered by all
    ** pagers the database handle is connected to. *pHighwater is always set 
    ** to zero.
    */
    case SQLITE_DBSTATUS_CACHE_SPILL:
      op = SQLITE_DBSTATUS_CACHE_WRITE+1;
      /* Fall through into the next case */
    case SQLITE_DBSTATUS_CACHE_HIT:
    case SQLITE_DBSTATUS_CACHE_MISS:
    case SQLITE_DBSTATUS_CACHE_WRITE:{
      int i;
      int nRet = 0;
      assert( SQLITE_DBSTATUS_CACHE_MISS==SQLITE_DBSTATUS_CACHE_HIT+1 );
      assert( SQLITE_DBSTATUS_CACHE_WRITE==SQLITE_DBSTATUS_CACHE_HIT+2 );

      for(i=0; i<db->nDb; i++){
        if( db->aDb[i].pBt ){
          Pager *pPager = sqlite3BtreePager(db->aDb[i].pBt);
          sqlite3PagerCacheStat(pPager, op, resetFlag, &nRet);
        }
      }
      *pHighwater = 0; /* IMP: R-42420-56072 */
                       /* IMP: R-54100-20147 */
                       /* IMP: R-29431-39229 */
      *pCurrent = nRet;
      break;
    }

    /* Set *pCurrent to non-zero if there are unresolved deferred foreign
    ** key constraints.  Set *pCurrent to zero if all foreign key constraints
    ** have been satisfied.  The *pHighwater is always set to zero.
    */
    case SQLITE_DBSTATUS_DEFERRED_FKS: {
      *pHighwater = 0;  /* IMP: R-11967-56545 */
      *pCurrent = db->nDeferredImmCons>0 || db->nDeferredCons>0;
      break;
    }

    default: {
      rc = SQLITE_ERROR;
    }
  }
  sqlite3_mutex_leave(db->mutex);
  return rc;
}